

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v9::detail::write_ptr<char,fmt::v9::appender,unsigned_long>
                   (appender out,unsigned_long value,basic_format_specs<char> *specs)

{
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar1;
  anon_class_16_2_92d121e5 write;
  anon_class_16_2_92d121e5 local_28;
  
  local_28.num_digits = count_digits<4,unsigned_long>(value);
  local_28.value = value;
  if (specs == (basic_format_specs<char> *)0x0) {
    bVar1.container =
         (buffer<char> *)
         write_ptr<char,_fmt::v9::appender,_unsigned_long>::anon_class_16_2_92d121e5::operator()
                   (&local_28,
                    out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
  }
  else {
    bVar1.container =
         (buffer<char> *)
         write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_ptr<char,fmt::v9::appender,unsigned_long>(fmt::v9::appender,unsigned_long,fmt::v9::basic_format_specs<char>const*)::_lambda(fmt::v9::appender)_1_&>
                   (out,specs,(ulong)(uint)local_28.num_digits + 2,&local_28);
  }
  return (appender)bVar1.container;
}

Assistant:

auto write_ptr(OutputIt out, UIntPtr value,
               const basic_format_specs<Char>* specs) -> OutputIt {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  auto write = [=](reserve_iterator<OutputIt> it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}